

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rdopt.h
# Opt level: O0

int prune_ref_by_selective_ref_frame
              (AV1_COMP *cpi,MACROBLOCK *x,MV_REFERENCE_FRAME *ref_frame,
              uint *ref_display_order_hint)

{
  uint frame_display_order_hint;
  int iVar1;
  uint *ref_display_order_hint_00;
  MV_REFERENCE_FRAME *in_RCX;
  MV_REFERENCE_FRAME *in_RDX;
  MACROBLOCK *in_RSI;
  long in_RDI;
  int closest_ref_frames;
  int ref_frame_list_1 [2];
  int ref_frame_list [2];
  int comp_pred;
  SPEED_FEATURES *sf;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar2;
  undefined4 in_stack_ffffffffffffffc4;
  
  ref_display_order_hint_00 = (uint *)(in_RDI + 0x608c0);
  if (*(int *)(in_RDI + 0x60a90) == 0) {
    return 0;
  }
  frame_display_order_hint = (uint)('\0' < in_RDX[1]);
  if ((1 < *(int *)(in_RDI + 0x60a90)) ||
     ((*(int *)(in_RDI + 0x60a90) == 1 && (frame_display_order_hint != 0)))) {
    in_stack_ffffffffffffffc4 = 3;
    if ((in_RSI != (MACROBLOCK *)0x0) &&
       ((in_RSI->tpl_keep_ref_frame[3] != '\0' ||
        (in_RSI->pred_mv_sad[3] == in_RSI->best_pred_mv_sad[0])))) {
      in_stack_ffffffffffffffc4 = 0xffffffff;
    }
    iVar1 = prune_ref(in_RCX,ref_display_order_hint_00,frame_display_order_hint,
                      (int *)CONCAT44(in_stack_ffffffffffffffc4,in_stack_ffffffffffffffc0));
    if (iVar1 != 0) {
      return 1;
    }
  }
  if (2 < (int)ref_display_order_hint_00[0x74]) {
    uVar2 = 5;
    if ((in_RSI != (MACROBLOCK *)0x0) &&
       ((in_RSI->tpl_keep_ref_frame[5] != '\0' ||
        (in_RSI->pred_mv_sad[5] == in_RSI->best_pred_mv_sad[0])))) {
      uVar2 = 0xffffffff;
    }
    iVar1 = prune_ref(in_RCX,ref_display_order_hint_00,frame_display_order_hint,
                      (int *)CONCAT44(in_stack_ffffffffffffffc4,uVar2));
    if (iVar1 != 0) {
      return 1;
    }
  }
  if ((((in_RSI != (MACROBLOCK *)0x0) && (ref_display_order_hint_00[0x78] != 0)) &&
      (frame_display_order_hint != 0)) &&
     (iVar1 = has_closest_ref_frames
                        (in_RDX,*(int8_t *)(in_RDI + 0x9d324),*(int8_t *)(in_RDI + 0x9d325)),
     iVar1 == 0)) {
    if (1 < (int)ref_display_order_hint_00[0x78]) {
      return 1;
    }
    if ((ref_display_order_hint_00[0x78] == 1) &&
       (iVar1 = has_best_pred_mv_sad(in_RDX,in_RSI), iVar1 == 0)) {
      return 1;
    }
  }
  return 0;
}

Assistant:

static inline int prune_ref_by_selective_ref_frame(
    const AV1_COMP *const cpi, const MACROBLOCK *const x,
    const MV_REFERENCE_FRAME *const ref_frame,
    const unsigned int *const ref_display_order_hint) {
  const SPEED_FEATURES *const sf = &cpi->sf;
  if (!sf->inter_sf.selective_ref_frame) return 0;

  const int comp_pred = ref_frame[1] > INTRA_FRAME;

  if (sf->inter_sf.selective_ref_frame >= 2 ||
      (sf->inter_sf.selective_ref_frame == 1 && comp_pred)) {
    int ref_frame_list[2] = { LAST3_FRAME, LAST2_FRAME };

    if (x != NULL) {
      // Disable pruning if either tpl suggests that we keep the frame or
      // the pred_mv gives us the best sad
      if (x->tpl_keep_ref_frame[LAST3_FRAME] ||
          x->pred_mv_sad[LAST3_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[0] = NONE_FRAME;
      }
      if (x->tpl_keep_ref_frame[LAST2_FRAME] ||
          x->pred_mv_sad[LAST2_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[1] = NONE_FRAME;
      }
    }

    if (prune_ref(ref_frame, ref_display_order_hint,
                  ref_display_order_hint[GOLDEN_FRAME - LAST_FRAME],
                  ref_frame_list))
      return 1;
  }

  if (sf->inter_sf.selective_ref_frame >= 3) {
    int ref_frame_list[2] = { ALTREF2_FRAME, BWDREF_FRAME };

    if (x != NULL) {
      // Disable pruning if either tpl suggests that we keep the frame or
      // the pred_mv gives us the best sad
      if (x->tpl_keep_ref_frame[ALTREF2_FRAME] ||
          x->pred_mv_sad[ALTREF2_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[0] = NONE_FRAME;
      }
      if (x->tpl_keep_ref_frame[BWDREF_FRAME] ||
          x->pred_mv_sad[BWDREF_FRAME] == x->best_pred_mv_sad[0]) {
        ref_frame_list[1] = NONE_FRAME;
      }
    }

    if (prune_ref(ref_frame, ref_display_order_hint,
                  ref_display_order_hint[LAST_FRAME - LAST_FRAME],
                  ref_frame_list))
      return 1;
  }

  if (x != NULL && sf->inter_sf.prune_comp_ref_frames && comp_pred) {
    int closest_ref_frames = has_closest_ref_frames(
        ref_frame, cpi->ref_frame_dist_info.nearest_past_ref,
        cpi->ref_frame_dist_info.nearest_future_ref);
    if (closest_ref_frames == 0) {
      // Prune reference frames which are not the closest to the current frame.
      if (sf->inter_sf.prune_comp_ref_frames >= 2) {
        return 1;
      } else if (sf->inter_sf.prune_comp_ref_frames == 1) {
        // Prune reference frames with non minimum pred_mv_sad.
        if (has_best_pred_mv_sad(ref_frame, x) == 0) return 1;
      }
    }
  }

  return 0;
}